

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::LoginMessageTest_test_returns_formatted_string_Test::TestBody
          (LoginMessageTest_test_returns_formatted_string_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_60;
  Message local_58 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  LoginMessageTest_test_returns_formatted_string_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  bidfx_public_api::price::pixie::LoginMessage::ToString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[178],std::__cxx11::string>
            ((EqHelper<false> *)local_20,
             "\"Login(username=acozzoli, password=***, alias=nello, application=TradeSmart, version=3.7.0.88, api=Bidfx - C++, api_version=1.0, product=BidFXCpp, product_serial_number=29383BID)\""
             ,"login_message.ToString()",
             (char (*) [178])
             "Login(username=acozzoli, password=***, alias=nello, application=TradeSmart, version=3.7.0.88, api=Bidfx - C++, api_version=1.0, product=BidFXCpp, product_serial_number=29383BID)"
             ,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_58);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x8c,message);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(LoginMessageTest, test_returns_formatted_string)
{
    EXPECT_EQ("Login(username=acozzoli, password=***, alias=nello, application=TradeSmart, version=3.7.0.88, api=Bidfx - C++, api_version=1.0, product=BidFXCpp, product_serial_number=29383BID)",
                 login_message.ToString());
}